

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O1

void deqp::gls::StateQueryUtil::verifyBooleanVec4
               (ResultCollector *result,QueriedState *state,BVec4 *expected)

{
  ostream *poVar1;
  _Alloc_hider _Var2;
  GLboolean resultVec4 [4];
  GLboolean referenceVec4 [4];
  GLint64 reference_1 [4];
  GLfloat reference [4];
  ostringstream buf;
  undefined1 local_1e0 [8];
  string local_1d8;
  undefined1 local_1b8 [8];
  float local_1b0;
  float local_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_190 [376];
  
  switch(state->m_type) {
  case DATATYPE_FLOAT_VEC4:
    local_1ac = 1.0;
    local_1b8._0_4_ = 1.0;
    if (expected->m_data[0] == false) {
      local_1b8._0_4_ = 0.0;
    }
    local_1b8._4_4_ = 1.0;
    if (expected->m_data[1] == false) {
      local_1b8._4_4_ = 0.0;
    }
    local_1b0 = 1.0;
    if (expected->m_data[2] == false) {
      local_1b0 = 0.0;
    }
    if (expected->m_data[3] == false) {
      local_1ac = 0.0;
    }
    if (((state->m_v).vFloat == (float)local_1b8._0_4_) &&
       (!NAN((state->m_v).vFloat) && !NAN((float)local_1b8._0_4_))) {
      if (((state->m_v).vFloatVec4[1] == (float)local_1b8._4_4_) &&
         (!NAN((state->m_v).vFloatVec4[1]) && !NAN((float)local_1b8._4_4_))) {
        if (((state->m_v).vFloatVec4[2] == local_1b0) &&
           (!NAN((state->m_v).vFloatVec4[2]) && !NAN(local_1b0))) {
          if (((state->m_v).vFloatVec4[3] == local_1ac) &&
             (!NAN((state->m_v).vFloatVec4[3]) && !NAN(local_1ac))) {
            return;
          }
        }
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar1 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_1d8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    tcu::Format::operator<<(poVar1,(ArrayPointer<float> *)&local_1d8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER_VEC4:
    local_1b8._0_4_ = CONCAT31(0,expected->m_data[0]);
    local_1b8[4] = expected->m_data[1];
    local_1b8._5_3_ = 0;
    local_1b0 = (float)(uint)expected->m_data[2];
    local_1ac = (float)(uint)expected->m_data[3];
    if ((((state->m_v).vInt == local_1b8._0_4_) &&
        ((state->m_v).vIntVec3[1] == (uint)expected->m_data[1])) &&
       (((float)(state->m_v).vIntVec3[2] == local_1b0 &&
        ((float)(state->m_v).vIntVec3[3] == local_1ac)))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar1 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_1d8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    tcu::Format::operator<<(poVar1,(ArrayPointer<int> *)&local_1d8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_INTEGER64_VEC4:
    local_1d8._M_dataplus._M_p = (pointer)(ulong)expected->m_data[0];
    local_1d8._M_string_length = (size_type)expected->m_data[1];
    local_1d8.field_2._M_allocated_capacity = (size_type)expected->m_data[2];
    local_1d8.field_2._8_8_ = ZEXT18(expected->m_data[3]);
    if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(state->m_v).vInt64 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p) &&
        ((state->m_v).vInt64Vec4[1] == local_1d8._M_string_length)) &&
       (((state->m_v).vInt64Vec4[2] == local_1d8.field_2._M_allocated_capacity &&
        ((state->m_v).vInt64Vec4[3] == local_1d8.field_2._8_8_)))) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar1 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_1b8 = (undefined1  [8])&state->m_v;
    local_1b0 = 5.60519e-45;
    tcu::Format::operator<<(poVar1,(ArrayPointer<long> *)local_1b8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,(string *)local_1b8);
    _Var2._M_p = (pointer)local_1b8;
    if (local_1b8 != (undefined1  [8])&local_1a8) goto LAB_0186771e;
    goto LAB_01867726;
  case DATATYPE_UNSIGNED_INTEGER_VEC4:
    local_1b8._0_4_ = CONCAT31(0,expected->m_data[0]);
    local_1b8[4] = expected->m_data[1];
    local_1b8._5_3_ = 0;
    local_1b0 = (float)(uint)expected->m_data[2];
    local_1ac = (float)(uint)expected->m_data[3];
    if (((((state->m_v).vInt == local_1b8._0_4_) &&
         ((state->m_v).vIntVec3[1] == (uint)expected->m_data[1])) &&
        ((float)(state->m_v).vIntVec3[2] == local_1b0)) &&
       ((float)(state->m_v).vIntVec3[3] == local_1ac)) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    poVar1 = std::ostream::_M_insert<void_const*>(local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_1d8._M_dataplus._M_p = (pointer)&state->m_v;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    tcu::Format::operator<<(poVar1,(ArrayPointer<unsigned_int> *)&local_1d8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  case DATATYPE_BOOLEAN_VEC4:
    local_1e0[4] = expected->m_data[0];
    local_1e0[5] = expected->m_data[1];
    local_1e0[6] = expected->m_data[2];
    local_1e0[7] = expected->m_data[3];
    local_1e0[0] = (state->m_v).vBool;
    local_1e0[1] = (state->m_v).vBooleanVec4[1];
    local_1e0[2] = (state->m_v).vBooleanVec4[2];
    local_1e0[3] = (state->m_v).vBooleanVec4[3];
    if ((local_1e0[1] == local_1e0[5] && local_1e0[0] == local_1e0[4]) &&
       (local_1e0[3] == local_1e0[7] && local_1e0[2] == local_1e0[6])) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Expected ",9);
    local_1d8._M_dataplus._M_p = local_1e0 + 4;
    local_1d8._M_string_length = CONCAT44(local_1d8._M_string_length._4_4_,4);
    poVar1 = glu::detail::operator<<((ostream *)local_190,(BooleanPointerFmt *)&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", got ",6);
    local_1b8 = (undefined1  [8])local_1e0;
    local_1b0 = 5.60519e-45;
    glu::detail::operator<<(poVar1,(BooleanPointerFmt *)local_1b8);
    std::__cxx11::stringbuf::str();
    tcu::ResultCollector::fail(result,&local_1d8);
    break;
  default:
    goto switchD_018672c4_default;
  }
  local_1a8._M_allocated_capacity = local_1d8.field_2._M_allocated_capacity;
  _Var2._M_p = local_1d8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
LAB_0186771e:
    operator_delete(_Var2._M_p,local_1a8._M_allocated_capacity + 1);
  }
LAB_01867726:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
switchD_018672c4_default:
  return;
}

Assistant:

DataType QueriedState::getType (void) const
{
	return m_type;
}